

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O2

void __thiscall Type::GenParseCode2(Type *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  Exception *this_00;
  string datasize_str;
  string local_50;
  
  if (FLAGS_pac_debug) {
    fprintf(_stderr,"GenParseCode2 for %s\n",(this->data_id_str_)._M_dataplus._M_p);
  }
  if (this->attr_exportsourcedata_ == true) {
    if (this->incremental_parsing_ != true) {
      pcVar2 = Env::LValue(env,sourcedata_id);
      pcVar1 = (data->ptr_expr_)._M_dataplus._M_p;
      pcVar3 = Env::RValue(env,end_of_data);
      Output::println(out_cc,"%s = const_bytestring(%s, %s);",pcVar2,pcVar1,pcVar3);
      Env::SetEvaluated(env,sourcedata_id,true);
      GenParseCode3(this,out_cc,env,data,flags);
      DataSize_abi_cxx11_(&datasize_str,this,out_cc,env,data);
      pcVar2 = Env::LValue(env,sourcedata_id);
      Output::println(out_cc,"%s.set_end(%s + %s);",pcVar2,(data->ptr_expr_)._M_dataplus._M_p,
                      datasize_str._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&datasize_str);
      return;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"cannot export raw data for incrementally parsed types",
               (allocator<char> *)&datasize_str);
    Exception::Exception(this_00,&this->super_Object,&local_50);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  GenParseCode3(this,out_cc,env,data,flags);
  return;
}

Assistant:

void Type::GenParseCode2(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	DEBUG_MSG("GenParseCode2 for %s\n", data_id_str_.c_str());

	if ( attr_exportsourcedata_ )
		{
		if ( incremental_parsing() )
			{
			throw Exception(this, "cannot export raw data for incrementally parsed types");
			}

		out_cc->println("%s = const_bytestring(%s, %s);", env->LValue(sourcedata_id),
		                data.ptr_expr(), env->RValue(end_of_data));
		env->SetEvaluated(sourcedata_id);

		GenParseCode3(out_cc, env, data, flags);

		string datasize_str = DataSize(out_cc, env, data);
		out_cc->println("%s.set_end(%s + %s);", env->LValue(sourcedata_id), data.ptr_expr(),
		                datasize_str.c_str());
		}
	else
		{
		GenParseCode3(out_cc, env, data, flags);
		}
	}